

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d8skin.cpp
# Opt level: O3

void * rw::d3d8::skinOpen(void *o,int32 param_2,int32 param_3)

{
  DAT_0014b2b8 = ObjPipeline::create();
  DAT_0014b2b8->instanceCB = defaultInstanceCB;
  DAT_0014b2b8->uninstanceCB = defaultUninstanceCB;
  DAT_0014b2b8->renderCB = defaultRenderCB;
  (DAT_0014b2b8->super_ObjPipeline).super_Pipeline.pluginID = 0x116;
  (DAT_0014b2b8->super_ObjPipeline).super_Pipeline.pluginData = 1;
  return o;
}

Assistant:

static void*
skinOpen(void *o, int32, int32)
{
	skinGlobals.pipelines[PLATFORM_D3D8] = makeSkinPipeline();
	return o;
}